

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dagify.cpp
# Opt level: O2

void __thiscall
handlegraph::algorithms::SubHandleGraph::add_handle(SubHandleGraph *this,handle_t *handle)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  nid_t node_id;
  long local_10;
  
  iVar1 = (*this->super->_vptr_HandleGraph[4])();
  local_10 = CONCAT44(extraout_var,iVar1);
  lVar2 = this->min_id;
  if (local_10 <= this->min_id) {
    lVar2 = local_10;
  }
  this->min_id = lVar2;
  lVar2 = this->max_id;
  if (this->max_id < local_10) {
    lVar2 = local_10;
  }
  this->max_id = lVar2;
  std::__detail::
  _Insert_base<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::insert((_Insert_base<long_long,_long_long,_std::allocator<long_long>,_std::__detail::_Identity,_std::equal_to<long_long>,_std::hash<long_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            *)&this->contents,&local_10);
  return;
}

Assistant:

void SubHandleGraph::add_handle(const handle_t& handle) {
    
    nid_t node_id = super->get_id(handle);
    
    min_id = min(node_id, min_id);
    max_id = max(node_id, max_id);
    
    contents.insert(node_id);
}